

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O0

void __thiscall kj::CidrRange::zeroIrrelevantBits(CidrRange *this)

{
  uint uVar1;
  ulong uVar2;
  size_t n;
  CidrRange *this_local;
  
  if (this->bitCount < 0x80) {
    uVar1 = this->bitCount >> 3;
    this->bits[uVar1] = this->bits[uVar1] & (byte)(0xff00 >> ((byte)this->bitCount & 7));
    uVar2 = (ulong)((this->bitCount >> 3) + 1);
    memset(this->bits + uVar2,0,0x10 - uVar2);
  }
  return;
}

Assistant:

void CidrRange::zeroIrrelevantBits() {
  // Mask out insignificant bits of partial byte.
  if (bitCount < 128) {
    bits[bitCount / 8] &= 0xff00 >> (bitCount % 8);

    // Zero the remaining bytes.
    size_t n = bitCount / 8 + 1;
    memset(bits + n, 0, sizeof(bits) - n);
  }
}